

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

int32_t move_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info,
                   ecs_table_t *src_table,ecs_data_t *src_data,int32_t src_row,
                   ecs_table_t *dst_table,ecs_entities_t *added,ecs_entities_t *removed)

{
  ecs_record_t *record_00;
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  ecs_data_t *data;
  ecs_record_t *peVar4;
  _Bool local_4d;
  int32_t dst_row;
  ecs_record_t *record;
  ecs_data_t *dst_data;
  int32_t src_row_local;
  ecs_data_t *src_data_local;
  ecs_table_t *src_table_local;
  ecs_entity_info_t *info_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  data = ecs_table_get_or_create_data(dst_table);
  _ecs_assert(src_data != data,0xc,(char *)0x0,"src_data != dst_data",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3d9);
  if (src_data == data) {
    __assert_fail("src_data != dst_data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3d9,
                  "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  _Var1 = ecs_is_alive(world,entity);
  _ecs_assert(_Var1,2,(char *)0x0,"ecs_is_alive(world, entity)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3da);
  _Var1 = ecs_is_alive(world,entity);
  if (!_Var1) {
    __assert_fail("ecs_is_alive(world, entity)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3da,
                  "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  _ecs_assert(src_table != (ecs_table_t *)0x0,0xc,(char *)0x0,"src_table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3db);
  if (src_table == (ecs_table_t *)0x0) {
    __assert_fail("src_table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3db,
                  "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  _ecs_assert(src_data != (ecs_data_t *)0x0,0xc,(char *)0x0,"src_data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x3dc);
  if (src_data != (ecs_data_t *)0x0) {
    _ecs_assert(-1 < src_row,0xc,(char *)0x0,"src_row >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3dd);
    if (src_row < 0) {
      __assert_fail("src_row >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x3dd,
                    "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                   );
    }
    iVar2 = ecs_vector_count(src_data->entities);
    _ecs_assert(src_row < iVar2,0xc,(char *)0x0,"ecs_vector_count(src_data->entities) > src_row",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3df);
    iVar2 = ecs_vector_count(src_data->entities);
    if (src_row < iVar2) {
      record_00 = info->record;
      local_4d = true;
      if (record_00 != (ecs_record_t *)0x0) {
        peVar4 = (ecs_record_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity);
        local_4d = record_00 == peVar4;
      }
      _ecs_assert(local_4d,0xc,(char *)0x0,"!record || record == ecs_eis_get(world, entity)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3e3);
      if ((record_00 != (ecs_record_t *)0x0) &&
         (peVar4 = (ecs_record_t *)_ecs_sparse_get_sparse((world->store).entity_index,0x10,entity),
         record_00 != peVar4)) {
        __assert_fail("!record || record == ((ecs_record_t*)_ecs_sparse_get_sparse((world->store).entity_index, sizeof(ecs_record_t), entity))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x3e3,
                      "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      iVar2 = ecs_table_append(world,dst_table,data,entity,record_00,false);
      record_00->table = dst_table;
      iVar3 = ecs_row_to_record(iVar2,(_Bool)(info->is_watched & 1));
      record_00->row = iVar3;
      iVar3 = ecs_vector_count(src_data->entities);
      _ecs_assert(src_row < iVar3,0xc,(char *)0x0,"ecs_vector_count(src_data->entities) > src_row",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3ec);
      iVar3 = ecs_vector_count(src_data->entities);
      if (iVar3 <= src_row) {
        __assert_fail("ecs_vector_count(src_data->entities) > src_row",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x3ec,
                      "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                     );
      }
      if (((src_table->type != (ecs_type_t)0x0) &&
          (ecs_table_move(world,entity,entity,dst_table,data,iVar2,src_table,src_data,src_row),
          removed != (ecs_entities_t *)0x0)) && ((src_table->flags & 0xd104) != 0)) {
        ecs_run_monitors(world,dst_table,src_table->un_set_all,src_row,1,dst_table->un_set_all);
        ecs_run_remove_actions(world,src_table,src_data,src_row,1,removed,false);
      }
      ecs_table_delete(world,src_table,src_data,src_row,false);
      if ((src_table != dst_table) || ((added != (ecs_entities_t *)0x0 && (added->count != 0)))) {
        if ((added != (ecs_entities_t *)0x0) && ((dst_table->flags & 0x1a884) != 0)) {
          ecs_run_add_actions(world,dst_table,data,iVar2,1,added,false,true);
        }
        if ((dst_table->flags & 0x8000) != 0) {
          ecs_run_monitors(world,dst_table,dst_table->monitors,iVar2,1,src_table->monitors);
        }
        if ((removed != (ecs_entities_t *)0x0) && ((dst_table->flags & 4) != 0)) {
          ecs_run_monitors(world,dst_table,src_table->on_set_override,iVar2,1,
                           dst_table->on_set_override);
        }
      }
      info->data = data;
      return iVar2;
    }
    __assert_fail("ecs_vector_count(src_data->entities) > src_row",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                  ,0x3df,
                  "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
                 );
  }
  __assert_fail("src_data != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x3dc,
                "int32_t move_entity(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_table_t *, ecs_data_t *, int32_t, ecs_table_t *, ecs_entities_t *, ecs_entities_t *)"
               );
}

Assistant:

static
int32_t move_entity(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info,
    ecs_table_t * src_table,
    ecs_data_t * src_data,
    int32_t src_row,
    ecs_table_t * dst_table,
    ecs_entities_t * added,
    ecs_entities_t * removed)
{    
    ecs_data_t *dst_data = ecs_table_get_or_create_data(dst_table);
    ecs_assert(src_data != dst_data, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(ecs_is_alive(world, entity), ECS_INVALID_PARAMETER, NULL);
    ecs_assert(src_table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(src_data != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(src_row >= 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(ecs_vector_count(src_data->entities) > src_row, 
        ECS_INTERNAL_ERROR, NULL);

    ecs_record_t *record = info->record;
    ecs_assert(!record || record == ecs_eis_get(world, entity), 
        ECS_INTERNAL_ERROR, NULL);

    int32_t dst_row = ecs_table_append(world, dst_table, dst_data, entity, 
        record, false);

    record->table = dst_table;
    record->row = ecs_row_to_record(dst_row, info->is_watched);

    ecs_assert(ecs_vector_count(src_data->entities) > src_row, 
        ECS_INTERNAL_ERROR, NULL);

    /* Copy entity & components from src_table to dst_table */
    if (src_table->type) {
        ecs_table_move(world, entity, entity, dst_table, dst_data, dst_row, 
            src_table, src_data, src_row);

        /* If components were removed, invoke remove actions before deleting */
        if (removed && (src_table->flags & EcsTableHasRemoveActions)) {
            /* If entity was moved, invoke UnSet monitors for each component that
             * the entity no longer has */
            ecs_run_monitors(world, dst_table, src_table->un_set_all, 
                src_row, 1, dst_table->un_set_all);

            ecs_run_remove_actions(
                world, src_table, src_data, src_row, 1, removed, false);
        }            
    }
    
    ecs_table_delete(world, src_table, src_data, src_row, false);

    /* If components were added, invoke add actions */
    if (src_table != dst_table || (added && added->count)) {
        if (added && (dst_table->flags & EcsTableHasAddActions)) {
            ecs_run_add_actions(
                world, dst_table, dst_data, dst_row, 1, added, false, true);
        }

        /* Run monitors */
        if (dst_table->flags & EcsTableHasMonitors) {
            ecs_run_monitors(world, dst_table, dst_table->monitors, dst_row, 
                1, src_table->monitors);
        }

        /* If removed components were overrides, run OnSet systems for those, as 
         * the value of those components changed from the removed component to 
         * the value of component on the base entity */
        if (removed && dst_table->flags & EcsTableHasBase) {
            ecs_run_monitors(world, dst_table, src_table->on_set_override, 
                dst_row, 1, dst_table->on_set_override);          
        }
    }

    info->data = dst_data;

    return dst_row;
}